

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t sse4_despace_trail(char *bytes,size_t howmany)

{
  undefined1 auVar1 [16];
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int k;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (howmany < 0x10) {
    uVar10 = 0;
    sVar6 = 0;
  }
  else {
    auVar12[8] = 0x20;
    auVar12._0_8_ = 0x2020202020202020;
    auVar12[9] = 0x20;
    auVar12[10] = 0x20;
    auVar12[0xb] = 0x20;
    auVar12[0xc] = 0x20;
    auVar12[0xd] = 0x20;
    auVar12[0xe] = 0x20;
    auVar12[0xf] = 0x20;
    auVar13[8] = 10;
    auVar13._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar13[9] = 10;
    auVar13[10] = 10;
    auVar13[0xb] = 10;
    auVar13[0xc] = 10;
    auVar13[0xd] = 10;
    auVar13[0xe] = 10;
    auVar13[0xf] = 10;
    auVar14[8] = 0xd;
    auVar14._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar14[9] = 0xd;
    auVar14[10] = 0xd;
    auVar14[0xb] = 0xd;
    auVar14[0xc] = 0xd;
    auVar14[0xd] = 0xd;
    auVar14[0xe] = 0xd;
    auVar14[0xf] = 0xd;
    sVar6 = 0;
    pcVar7 = bytes;
    uVar8 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(bytes + uVar8);
      uVar3 = vpcmpeqb_avx512vl(auVar1,auVar12);
      uVar4 = vpcmpeqb_avx512vl(auVar1,auVar13);
      uVar5 = (ushort)uVar3 | (ushort)uVar4;
      uVar3 = vpcmpeqb_avx512vl(auVar1,auVar14);
      if (uVar5 == 0 && (ushort)uVar3 == 0) {
        *(undefined1 (*) [16])(bytes + sVar6) = auVar1;
        sVar6 = sVar6 + 0x10;
      }
      else {
        lVar11 = 0;
        do {
          if (((ushort)(uVar5 | (ushort)uVar3) >> ((uint)lVar11 & 0x1f) & 1) == 0) {
            bytes[sVar6] = pcVar7[lVar11];
            sVar6 = sVar6 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
      }
      uVar10 = uVar8 + 0x10;
      uVar9 = uVar8 + 0x1f;
      pcVar7 = pcVar7 + 0x10;
      uVar8 = uVar10;
    } while (uVar9 < howmany);
  }
  if (uVar10 < howmany) {
    do {
      bVar2 = bytes[uVar10];
      if ((0x20 < (ulong)bVar2) || ((0x100002400U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
        bytes[sVar6] = bVar2;
        sVar6 = sVar6 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (howmany != uVar10);
  }
  return sVar6;
}

Assistant:

size_t sse4_despace_trail(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 15 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    // we do it the naive way, could be smarter?
    __m128i xspaces = _mm_cmpeq_epi8(x, spaces);
    __m128i xnewline = _mm_cmpeq_epi8(x, newline);
    __m128i xcarriage = _mm_cmpeq_epi8(x, carriage);
    __m128i anywhite = _mm_or_si128(_mm_or_si128(xspaces, xnewline), xcarriage);
    int mask16 = _mm_movemask_epi8(anywhite);
    if (mask16 == 0) { // no match!
      _mm_storeu_si128((__m128i *)(bytes + pos), x);
      pos += 16;
    } else {
      for (int k = 0; k < 16; ++k) {
        if (mask16 & (1 << k))
          continue;
        bytes[pos++] = bytes[i + k];
      }
    }
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}